

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pig.cpp
# Opt level: O2

bool __thiscall Pig::getDecimal(Pig *this,string *result)

{
  char cVar1;
  bool bVar2;
  pointer pcVar3;
  element_type *peVar4;
  size_type sVar5;
  size_type sVar6;
  string local_40 [32];
  
  sVar6 = this->_cursor;
  pcVar3 = (((this->_text).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_M_dataplus)._M_p;
  cVar1 = pcVar3[sVar6];
  if ((cVar1 == '-') || (cVar1 == '+')) {
    cVar1 = pcVar3[sVar6 + 1];
    sVar6 = sVar6 + 1;
  }
  if ((cVar1 == '\0') || (bVar2 = unicodeLatinDigit((int)cVar1), !bVar2)) {
    bVar2 = false;
  }
  else {
    sVar6 = sVar6 + 1;
    do {
      sVar5 = sVar6;
      peVar4 = (this->_text).
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      cVar1 = (peVar4->_M_dataplus)._M_p[sVar5];
      if (cVar1 == '\0') goto LAB_001563f7;
      bVar2 = unicodeLatinDigit((int)cVar1);
      sVar6 = sVar5 + 1;
    } while (bVar2);
    peVar4 = (this->_text).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    pcVar3 = (peVar4->_M_dataplus)._M_p;
    if (pcVar3[sVar5] == '.') {
      while (sVar5 = sVar6, pcVar3[sVar5] != '\0') {
        bVar2 = unicodeLatinDigit((int)pcVar3[sVar5]);
        peVar4 = (this->_text).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        if (!bVar2) break;
        sVar6 = sVar5 + 1;
        pcVar3 = (peVar4->_M_dataplus)._M_p;
      }
    }
LAB_001563f7:
    std::__cxx11::string::substr((ulong)local_40,(ulong)peVar4);
    std::__cxx11::string::operator=((string *)result,local_40);
    std::__cxx11::string::~string(local_40);
    this->_cursor = sVar5;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool Pig::getDecimal (std::string& result)
{
  auto i = _cursor;

  // [+-]?
  if ((*_text)[i] &&
      ((*_text)[i] == '-' ||
       (*_text)[i] == '+'))
    ++i;

  // digit+
  if ((*_text)[i] && unicodeLatinDigit ((*_text)[i]))
  {
    ++i;

    while ((*_text)[i] && unicodeLatinDigit ((*_text)[i]))
      ++i;

    // ( . digit+ )?
    if ((*_text)[i] && (*_text)[i] == '.')
    {
      ++i;

      while ((*_text)[i] && unicodeLatinDigit ((*_text)[i]))
        ++i;
    }

    result = _text->substr (_cursor, i - _cursor);
    _cursor = i;
    return true;
  }

  return false;
}